

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<64U,_24U,_buffer_layout_bfs>::operator()
          (fill<64U,_24U,_buffer_layout_bfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  uchar *puVar4;
  uchar *__s2;
  array<unsigned_long,_64UL> *paVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  unsigned_long *puVar9;
  DI __d;
  size_t local_70;
  size_t local_68;
  fill<64U,_48U,_buffer_layout_bfs> local_5c;
  fill<64U,_49U,_buffer_layout_bfs> local_5b;
  fill<64U,_49U,_buffer_layout_bfs> local_5a;
  fill<64U,_48U,_buffer_layout_bfs> local_59;
  uchar **local_58;
  array<Stream,_64UL> *local_50;
  unsigned_long *local_48;
  DI local_40;
  array<unsigned_long,_64UL> *local_38;
  
  local_50 = streams;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"fill_inner",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", inner, I=",0xb);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  local_40.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_48 = buffer_count->_M_elems + 0x30;
  puVar1 = buffer_count->_M_elems + 0x31;
  local_58 = buffer + 0x10ac;
  local_68 = 0;
  local_70 = 0;
  local_38 = buffer_count;
  do {
    paVar5 = local_38;
    puVar9 = local_48;
    if ((*local_48 == 0) &&
       (fill<64U,_48U,_buffer_layout_bfs>::operator()(&local_59,local_50,buffer,local_38),
       *puVar9 == 0)) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"left stream drained\n",0x14);
      local_70 = -local_70;
      local_68 = -local_68;
      goto LAB_001513ce;
    }
    if ((*puVar1 == 0) &&
       (fill<64U,_49U,_buffer_layout_bfs>::operator()(&local_5a,local_50,buffer,paVar5),
       *puVar1 == 0)) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"right stream drained\n",0x15);
      local_70 = -local_70;
      local_68 = -local_68;
      goto LAB_001514c5;
    }
    uVar2 = *puVar9;
    uVar3 = *puVar1;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"L:\'",3);
    puVar4 = buffer[-uVar2 + 0x1273];
    if (puVar4 == (uchar *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar8 = strlen((char *)puVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)puVar4,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\', R:\'",6);
    puVar4 = buffer[-uVar3 + 0x128a];
    if (puVar4 == (uchar *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar8 = strlen((char *)puVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)puVar4,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
    puVar4 = buffer[-uVar2 + 0x1273];
    if (puVar4 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[-uVar3 + 0x128a];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar6 = strcmp((char *)puVar4,(char *)__s2);
    puVar9 = puVar1;
    if (iVar6 < 1) {
      puVar9 = local_48;
      __s2 = puVar4;
    }
    buffer[local_68 + 0x10ac] = __s2;
    *puVar9 = *puVar9 - 1;
    check_input(local_58,local_68);
    paVar5 = local_38;
    local_70 = local_70 + -8;
    local_68 = local_68 + 1;
  } while (local_68 != 8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Done, buffer filled\n",0x14);
  paVar5->_M_elems[0x18] = 8;
  goto LAB_00151649;
  while( true ) {
    uVar2 = paVar5->_M_elems[0x31];
    *(uchar **)((long)buffer + local_70 + 0x8560) = buffer[0x128a - uVar2];
    paVar5->_M_elems[0x31] = uVar2 - 1;
    local_68 = local_68 + -1;
    local_70 = local_70 + 8;
    if (local_70 == 0x40) break;
LAB_001513ce:
    if ((paVar5->_M_elems[0x31] == 0) &&
       (fill<64U,_49U,_buffer_layout_bfs>::operator()(&local_5b,local_50,buffer,paVar5),
       paVar5->_M_elems[0x31] == 0)) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"both streams prematurely drained\n",0x21);
      memmove(buffer + local_68 + 0x10b4,local_58,local_70);
      paVar5->_M_elems[0x18] = -local_68;
      check_input((uchar **)((long)buffer + (0x85a0 - local_70)),-local_68);
      goto LAB_00151649;
    }
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tbuffer filled\n",0xf);
  paVar5->_M_elems[0x18] = 8;
  check_input(local_58,8);
  goto LAB_00151649;
  while( true ) {
    uVar2 = *puVar9;
    *(uchar **)((long)buffer + local_70 + 0x8560) = buffer[0x1273 - uVar2];
    *puVar9 = uVar2 - 1;
    local_68 = local_68 + -1;
    local_70 = local_70 + 8;
    if (local_70 == 0x40) break;
LAB_001514c5:
    if ((*puVar9 == 0) &&
       (fill<64U,_48U,_buffer_layout_bfs>::operator()(&local_5c,local_50,buffer,paVar5),
       *puVar9 == 0)) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"both streams prematurely drained\n",0x21);
      memmove(buffer + local_68 + 0x10b4,local_58,local_70);
      paVar5->_M_elems[0x18] = -local_68;
      check_input((uchar **)((long)buffer + (0x85a0 - local_70)),-local_68);
      goto LAB_00151649;
    }
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"buffer filled\n",0xe);
  paVar5->_M_elems[0x18] = 8;
  check_input(local_58,8);
LAB_00151649:
  anon_func::DI::~DI(&local_40);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}